

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

TidyMessageImpl *
formatAccessReport(TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,
                  __va_list_tag *args)

{
  byte *pbVar1;
  TidyMessageImpl *pTVar2;
  
  pbVar1 = (byte *)((long)&doc->badAccess + 3);
  *pbVar1 = *pbVar1 | 0x80;
  pTVar2 = prvTidytidyMessageCreateWithNode(doc,node,code,level);
  return pTVar2;
}

Assistant:

TidyMessageImpl *formatAccessReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    doc->badAccess |= BA_WAI;

    /* Currently *all* cases are handled in the default, but maintain this
       structure for possible future cases. */
    switch (code)
    {
        default:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level );
    }

    return NULL;
}